

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::make_content_range_header_field_abi_cxx11_
                   (pair<long,_long> *range,size_t content_length)

{
  long *in_RSI;
  string *in_RDI;
  string *field;
  string local_90 [32];
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  string local_50 [54];
  allocator<char> local_1a;
  undefined1 local_19;
  long *local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::allocator<char>::~allocator(&local_1a);
  if (*local_10 != -1) {
    std::__cxx11::to_string(in_stack_ffffffffffffffa8);
    std::__cxx11::string::operator+=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"-");
  if (local_10[1] != -1) {
    std::__cxx11::to_string(in_stack_ffffffffffffffa8);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"/");
  std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff98);
  std::__cxx11::string::operator+=((string *)in_RDI,local_90);
  std::__cxx11::string::~string(local_90);
  return in_RDI;
}

Assistant:

inline std::string
make_content_range_header_field(const std::pair<ssize_t, ssize_t> &range,
                                size_t content_length) {
  std::string field = "bytes ";
  if (range.first != -1) { field += std::to_string(range.first); }
  field += "-";
  if (range.second != -1) { field += std::to_string(range.second); }
  field += "/";
  field += std::to_string(content_length);
  return field;
}